

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Stress::LongRunningTests::init(LongRunningTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int maxBufMemoryUsageBytes;
  Context *pCVar2;
  TestContext *pTVar3;
  RenderContext *pRVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  TestNode *pTVar7;
  Case *pCVar8;
  Case_conflict *pCVar9;
  ulong *name;
  ulong *desc;
  bool bVar10;
  int extraout_EAX;
  TestNode *pTVar11;
  LongStressCase *pLVar12;
  long *plVar13;
  long lVar14;
  TestNode *pTVar15;
  pointer pPVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong *puVar18;
  char *pcVar19;
  undefined8 uVar20;
  pointer pPVar21;
  int iVar22;
  Probs *pPVar23;
  bool bVar24;
  EVP_PKEY_CTX *pEVar25;
  long lVar26;
  FeatureProbabilities *probabilities;
  ProgramLibrary progLib;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  LongStressCase *local_1b8;
  TestNode *local_1b0;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_2;
  allocator_type local_169;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 uStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> local_108;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> local_f0;
  void *local_d8;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  TestNode *local_98;
  TestNode *local_90;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_4;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> local_48;
  
  pEVar25 = (EVP_PKEY_CTX *)&progLib;
  deqp::gls::LongStressTestUtil::ProgramLibrary::ProgramLibrary
            ((ProgramLibrary *)pEVar25,GLSL_VERSION_300_ES);
  if (init()::memoryLimitCases == '\0') {
    init(pEVar25);
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext
            ((ProgramContext *)&local_148,&progLib,4);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&contexts,1,(value_type *)&local_148,(allocator_type *)&contexts_2);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118._M_allocated_capacity + 1);
  }
  uVar20 = local_148._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)uVar20);
  }
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pCVar2->m_testCtx,"buffer","Buffer stress tests");
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  lVar14 = 0;
  local_1b0 = (TestNode *)this;
  local_98 = pTVar11;
  bVar10 = true;
  do {
    bVar24 = bVar10;
    lVar26 = 5;
    pCVar8 = init::cases;
    do {
      pPVar23 = &pCVar8->probs;
      uVar1 = *(uint *)((long)(pPVar23 + -1) + 0x38);
      if ((int)uVar1 < 1) {
        uVar1 = init::memoryLimitCases[lVar14].redundantBufferFactor;
      }
      pLVar12 = (LongStressCase *)operator_new(0x178);
      pTVar3 = ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode)->m_testCtx;
      pRVar4 = ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode)->m_renderCtx;
      local_1f8 = &local_1e8;
      local_1f0 = 0;
      local_1e8 = local_1e8 & 0xffffffffffffff00;
      local_1b8 = (LongStressCase *)(ulong)uVar1;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&contexts_2.
                     super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pPVar16 = (pointer)(plVar13 + 2);
      if ((pointer)*plVar13 == pPVar16) {
        pcVar5 = (pPVar16->vertexSource)._M_dataplus._M_p;
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pcVar5,0);
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)pcVar5 >> 0x20);
      }
      else {
        pcVar5 = (pPVar16->vertexSource)._M_dataplus._M_p;
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pcVar5,0);
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)pcVar5 >> 0x20);
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
      }
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar13[1];
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)plVar13[1] >> 0x20);
      *plVar13 = (long)pPVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&contexts_2);
      local_148._M_allocated_capacity = (size_type)&local_138;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar17) {
        local_138._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_138._8_8_ = plVar13[3];
      }
      else {
        local_138._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_148._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar13;
      }
      uVar20 = local_148._M_allocated_capacity;
      local_148._8_8_ = plVar13[1];
      *plVar13 = (long)paVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_1d8 = &local_1c8;
      local_1d0 = 0;
      local_1c8 = local_1c8 & 0xffffffffffffff00;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      local_238 = &local_228;
      puVar18 = (ulong *)(plVar13 + 2);
      if ((ulong *)*plVar13 == puVar18) {
        local_228 = *puVar18;
        lStack_220 = plVar13[3];
      }
      else {
        local_228 = *puVar18;
        local_238 = (ulong *)*plVar13;
      }
      local_230 = plVar13[1];
      *plVar13 = (long)puVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_218 = &local_208;
      puVar18 = (ulong *)(plVar13 + 2);
      if ((ulong *)*plVar13 == puVar18) {
        local_208 = *puVar18;
        lStack_200 = plVar13[3];
      }
      else {
        local_208 = *puVar18;
        local_218 = (ulong *)*plVar13;
      }
      local_210 = plVar13[1];
      *plVar13 = (long)puVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_90 = (TestNode *)lVar26;
      deqp::gls::LongStressCase::LongStressCase
                (pLVar12,pTVar3,pRVar4,(char *)uVar20,(char *)local_218,0,
                 init::memoryLimitCases[lVar14].limit,1,50000,&contexts,pPVar23,0x88e8,0x88e8,
                 (int)local_1b8,false);
      tcu::TestNode::addChild(local_98,(TestNode *)pLVar12);
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      this = (LongRunningTests *)local_1b0;
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_allocated_capacity != &local_138) {
        operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1)
        ;
      }
      if (contexts_2.
          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&contexts_2.
                    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(contexts_2.
                        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT44(contexts_2.
                                 super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 contexts_2.
                                 super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) + 1);
      }
      pTVar11 = local_90;
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      pCVar8 = (Case *)(pPVar23 + 1);
      lVar26 = (long)pTVar11 + -1;
    } while (lVar26 != 0);
    lVar14 = 1;
    bVar10 = false;
  } while (bVar24);
  pEVar25 = (EVP_PKEY_CTX *)&contexts;
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             pEVar25);
  if (init()::memoryLimitCases == '\0') {
    init(pEVar25);
  }
  if (init()::cases == '\0') {
    init(pEVar25);
  }
  pTVar11 = (TestNode *)operator_new(0x78);
  pp_Var6 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  pcVar19 = "Texture stress tests";
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,(TestContext *)*pp_Var6,"texture","Texture stress tests");
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar11[1]._vptr_TestNode = pp_Var6;
  local_90 = pTVar11;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  uVar20 = CONCAT71((int7)((ulong)pcVar19 >> 8),1);
  lVar14 = 0;
  do {
    local_98 = (TestNode *)CONCAT44(local_98._4_4_,(int)uVar20);
    lVar26 = 4;
    pCVar9 = init()::cases;
    do {
      pPVar23 = &pCVar9->probs;
      iVar22 = *(int *)((long)(pPVar23 + -1) + 0x38);
      if (iVar22 < 1) {
        iVar22 = init()::memoryLimitCases[lVar14].numTextures;
      }
      deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
                ((ProgramContext *)&local_148,&progLib,iVar22,0x200,0x200,0.1);
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
                (&contexts,1,(value_type *)&local_148,(allocator_type *)&contexts_2);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (local_d8 != (void *)0x0) {
        operator_delete(local_d8,local_c8 - (long)local_d8);
      }
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_allocated_capacity != &local_138) {
        operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1)
        ;
      }
      local_1b8 = (LongStressCase *)operator_new(0x178);
      pTVar3 = (TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pRVar4 = (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1];
      local_1f8 = &local_1e8;
      local_1f0 = 0;
      local_1e8 = local_1e8 & 0xffffffffffffff00;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&contexts_2.
                     super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pPVar16 = (pointer)(plVar13 + 2);
      if ((pointer)*plVar13 == pPVar16) {
        pcVar5 = (pPVar16->vertexSource)._M_dataplus._M_p;
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pcVar5,0);
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)pcVar5 >> 0x20);
      }
      else {
        pcVar5 = (pPVar16->vertexSource)._M_dataplus._M_p;
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pcVar5,0);
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)pcVar5 >> 0x20);
        contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
      }
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar13[1];
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)plVar13[1] >> 0x20);
      *plVar13 = (long)pPVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&contexts_2);
      local_148._M_allocated_capacity = (size_type)&local_138;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar17) {
        local_138._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_138._8_8_ = plVar13[3];
      }
      else {
        local_138._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_148._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar13;
      }
      uVar20 = local_148._M_allocated_capacity;
      local_148._8_8_ = plVar13[1];
      *plVar13 = (long)paVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_1d8 = &local_1c8;
      local_1d0 = 0;
      local_1c8 = local_1c8 & 0xffffffffffffff00;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      local_238 = &local_228;
      puVar18 = (ulong *)(plVar13 + 2);
      if ((ulong *)*plVar13 == puVar18) {
        local_228 = *puVar18;
        lStack_220 = plVar13[3];
      }
      else {
        local_228 = *puVar18;
        local_238 = (ulong *)*plVar13;
      }
      local_230 = plVar13[1];
      *plVar13 = (long)puVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_238);
      pLVar12 = local_1b8;
      local_218 = &local_208;
      puVar18 = (ulong *)(plVar13 + 2);
      if ((ulong *)*plVar13 == puVar18) {
        local_208 = *puVar18;
        lStack_200 = plVar13[3];
      }
      else {
        local_208 = *puVar18;
        local_218 = (ulong *)*plVar13;
      }
      local_210 = plVar13[1];
      *plVar13 = (long)puVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      deqp::gls::LongStressCase::LongStressCase
                (local_1b8,pTVar3,pRVar4,(char *)uVar20,(char *)local_218,
                 init()::memoryLimitCases[lVar14].limit,0x100000,1,10000,&contexts,pPVar23,0x88e4,
                 0x88e4,1,false);
      tcu::TestNode::addChild(local_90,(TestNode *)pLVar12);
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      this = (LongRunningTests *)local_1b0;
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_allocated_capacity != &local_138) {
        operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1)
        ;
      }
      if (contexts_2.
          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&contexts_2.
                    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(contexts_2.
                        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT44(contexts_2.
                                 super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 contexts_2.
                                 super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
                (&contexts);
      pCVar9 = (Case_conflict *)(pPVar23 + 1);
      lVar26 = lVar26 + -1;
    } while (lVar26 != 0);
    lVar14 = 1;
    uVar20 = 0;
  } while (((ulong)local_98 & 1) != 0);
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
            ((ProgramContext *)&local_148,&progLib,1,0x80,0x80,0.5);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&contexts_2,1,(value_type *)&local_148,(allocator_type *)&local_1f8);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118._M_allocated_capacity + 1);
  }
  uVar20 = local_148._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)uVar20);
  }
  pTVar11 = (TestNode *)operator_new(0x78);
  pp_Var6 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,(TestContext *)*pp_Var6,"draw_call","Draw call stress tests");
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar11[1]._vptr_TestNode = pp_Var6;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  probabilities = &init()::cases[0].probs;
  lVar14 = 4;
  do {
    pLVar12 = (LongStressCase *)operator_new(0x178);
    deqp::gls::LongStressCase::LongStressCase
              (pLVar12,((Context *)local_1b0[1]._vptr_TestNode)->m_testCtx,
               ((Context *)local_1b0[1]._vptr_TestNode)->m_renderCtx,
               *(char **)&probabilities[-1].clientMemoryAttributeData,
               *(char **)&probabilities[-1].randomBufferUploadTarget,0x100000,0x200000,
               (int)probabilities[-1].useDrawArrays,(int)probabilities[-1].separateAttributeBuffers,
               &contexts_2,probabilities,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild(pTVar11,(TestNode *)pLVar12);
    probabilities = (FeatureProbabilities *)&probabilities[1].wastefulTextureMemoryUsage;
    lVar14 = lVar14 + -1;
  } while (lVar14 != 0);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            (&contexts_2);
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  contexts_2.
  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
            ((ProgramContext *)&local_148,&progLib,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
  emplace_back<deqp::gls::ProgramContext>(&contexts_2,(ProgramContext *)&local_148);
  pTVar11 = local_1b0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
            ((ProgramContext *)&local_148,&progLib,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
  emplace_back<deqp::gls::ProgramContext>(&contexts_2,(ProgramContext *)&local_148);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118._M_allocated_capacity + 1);
  }
  uVar20 = local_148._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)uVar20);
  }
  pTVar15 = (TestNode *)operator_new(0x78);
  pp_Var6 = pTVar11[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var6,"program",
             "Shader program stress tests");
  pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar15[1]._vptr_TestNode = pp_Var6;
  tcu::TestNode::addChild(pTVar11,pTVar15);
  lVar14 = 0;
  bVar10 = true;
  do {
    bVar24 = bVar10;
    pLVar12 = (LongStressCase *)operator_new(0x178);
    deqp::gls::LongStressCase::LongStressCase
              (pLVar12,(TestContext *)*local_1b0[1]._vptr_TestNode,
               (RenderContext *)local_1b0[1]._vptr_TestNode[1],init()::cases[lVar14].name,
               init()::cases[lVar14].desc,0x300000,0x100000,1,10000,&contexts_2,
               &init()::cases[lVar14].probs,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild(pTVar15,(TestNode *)pLVar12);
    lVar14 = 1;
    bVar10 = false;
  } while (bVar24);
  pEVar25 = (EVP_PKEY_CTX *)&contexts_2;
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             pEVar25);
  if (init()::memoryLimitCases == '\0') {
    init(pEVar25);
  }
  pTVar15 = (TestNode *)operator_new(0x78);
  pTVar11 = local_1b0;
  pp_Var6 = local_1b0[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar15,(TestContext *)*pp_Var6,"mixed","Mixed stress tests");
  pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212e700;
  pTVar15[1]._vptr_TestNode = pp_Var6;
  tcu::TestNode::addChild(pTVar11,pTVar15);
  lVar14 = 0;
  bVar10 = true;
  do {
    bVar24 = bVar10;
    local_1b8 = (LongStressCase *)operator_new(0x178);
    pTVar7 = (TestNode *)*pTVar11[1]._vptr_TestNode;
    pTVar11 = (TestNode *)pTVar11[1]._vptr_TestNode[1];
    local_238 = &local_228;
    local_230 = 0;
    local_228 = local_228 & 0xffffffffffffff00;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_218 = &local_208;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_208 = *puVar18;
      lStack_200 = plVar13[3];
    }
    else {
      local_208 = *puVar18;
      local_218 = (ulong *)*plVar13;
    }
    local_210 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_1f8 = &local_1e8;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_1e8 = *puVar18;
      lStack_1e0 = plVar13[3];
    }
    else {
      local_1e8 = *puVar18;
      local_1f8 = (ulong *)*plVar13;
    }
    name = local_1f8;
    local_1f0 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts_4.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)contexts_4.
                          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    local_90 = pTVar11;
    plVar13 = (long *)std::__cxx11::string::append((char *)&contexts_4);
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar16 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pPVar16) {
      contexts.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pPVar16->vertexSource)._M_dataplus._M_p;
    }
    else {
      contexts.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pPVar16->vertexSource)._M_dataplus._M_p;
      contexts.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
    }
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
    *plVar13 = (long)pPVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&contexts);
    local_1d8 = &local_1c8;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_1c8 = *puVar18;
      lStack_1c0 = plVar13[3];
    }
    else {
      local_1c8 = *puVar18;
      local_1d8 = (ulong *)*plVar13;
    }
    desc = local_1d8;
    local_1d0 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    iVar22 = init()::memoryLimitCases[lVar14].texLimit;
    maxBufMemoryUsageBytes = init()::memoryLimitCases[lVar14].bufLimit;
    local_98 = pTVar7;
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
              ((ProgramContext *)&local_148,&progLib,4,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
              (&local_48,1,(value_type *)&local_148,&local_169);
    pLVar12 = local_1b8;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = 0x3e99999a;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x3e99999a;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x3f000000;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f000000;
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3e4ccccd;
    deqp::gls::LongStressCase::LongStressCase
              (local_1b8,(TestContext *)local_98,(RenderContext *)local_90,(char *)name,(char *)desc
               ,iVar22,maxBufMemoryUsageBytes,1,10000,&local_48,(FeatureProbabilities *)&contexts_2,
               0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild(pTVar15,(TestNode *)pLVar12);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&local_48);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
    }
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8,local_c8 - (long)local_d8);
    }
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_allocated_capacity != &local_138) {
      operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
    }
    if (contexts.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (contexts_4.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts_4.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts_4.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts_4.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
              ((ProgramContext *)&local_148,&progLib,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
    emplace_back<deqp::gls::ProgramContext>(&contexts_4,(ProgramContext *)&local_148);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
    }
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8,local_c8 - (long)local_d8);
    }
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_allocated_capacity != &local_138) {
      operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
    }
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
              ((ProgramContext *)&local_148,&progLib,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
    emplace_back<deqp::gls::ProgramContext>(&contexts_4,(ProgramContext *)&local_148);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
    }
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8,local_c8 - (long)local_d8);
    }
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_f0);
    std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::~vector(&local_108);
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_allocated_capacity != &local_138) {
      operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
    }
    pLVar12 = (LongStressCase *)operator_new(0x178);
    pTVar3 = (TestContext *)*local_1b0[1]._vptr_TestNode;
    pRVar4 = (RenderContext *)local_1b0[1]._vptr_TestNode[1];
    local_218 = &local_208;
    local_210 = 0;
    local_208 = local_208 & 0xffffffffffffff00;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_1f8 = &local_1e8;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_1e8 = *puVar18;
      lStack_1e0 = plVar13[3];
    }
    else {
      local_1e8 = *puVar18;
      local_1f8 = (ulong *)*plVar13;
    }
    local_1f0 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    pPVar16 = (pointer)&contexts_2.
                        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar21 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pPVar21) {
      pcVar5 = (pPVar21->vertexSource)._M_dataplus._M_p;
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pcVar5,0);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
    }
    else {
      pcVar5 = (pPVar21->vertexSource)._M_dataplus._M_p;
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pcVar5,0);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
      pPVar16 = (pointer)*plVar13;
    }
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)plVar13[1];
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)plVar13[1] >> 0x20);
    *plVar13 = (long)pPVar21;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&contexts.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contexts.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)contexts.
                          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    contexts_2.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_start = pPVar16;
    plVar13 = (long *)std::__cxx11::string::append((char *)&contexts);
    local_1d8 = &local_1c8;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_1c8 = *puVar18;
      lStack_1c0 = plVar13[3];
    }
    else {
      local_1c8 = *puVar18;
      local_1d8 = (ulong *)*plVar13;
    }
    local_1d0 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_238 = &local_228;
    puVar18 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar18) {
      local_228 = *puVar18;
      lStack_220 = plVar13[3];
    }
    else {
      local_228 = *puVar18;
      local_238 = (ulong *)*plVar13;
    }
    local_230 = plVar13[1];
    *plVar13 = (long)puVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_148._M_allocated_capacity = 0x3e99999a3e99999a;
    local_148._8_8_ = 0x3e99999a3e99999a;
    local_138._M_allocated_capacity = 0x3e4ccccd3e99999a;
    local_138._8_8_ = 0x3e99999a3e4ccccd;
    local_118._8_4_ = 0x3ecccccd;
    local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x3e4ccccd3e99999a;
    uStack_120 = 0x3f8000003e4ccccd;
    local_118._M_allocated_capacity = 0x3ecccccd3f800000;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar12,pTVar3,pRVar4,(char *)pPVar16,(char *)local_238,
               init()::memoryLimitCases[lVar14].texLimit,init()::memoryLimitCases[lVar14].bufLimit,1
               ,10000,&contexts_4,(FeatureProbabilities *)&local_148,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild(pTVar15,(TestNode *)pLVar12);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    pTVar11 = local_1b0;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
    }
    if (contexts.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((contexts.
                                       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     vertexSource)._M_dataplus._M_p + 1));
    }
    if (contexts_2.
        super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&contexts_2.
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(contexts_2.
                      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT44(contexts_2.
                               super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               contexts_2.
                               super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&contexts_4);
    lVar14 = 1;
    bVar10 = false;
  } while (bVar24);
  return extraout_EAX;
}

Assistant:

void LongRunningTests::init (void)
{
	static const int								Mi			= 1<<20;
	const gls::LongStressTestUtil::ProgramLibrary	progLib		(glu::GLSL_VERSION_300_ES);

	typedef gls::LongStressCase::FeatureProbabilities Probs;

	// Buffer cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			redundantBufferFactor;
			MemCase (const char* n, const char* d, int l, int r) : nameSuffix(n), descSuffix(d), limit(l), redundantBufferFactor(r) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low buffer memory usage limit",	8*Mi,		2),
			MemCase("_high_memory",	"; use a high buffer memory usage limit",	256*Mi,		64)
		};

		const std::vector<gls::ProgramContext> contexts(1, progLib.generateBufferContext(4));

		static const struct Case
		{
			const char* const	name;
			const char*	const	desc;
			const int			redundantBufferFactor; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int bufFact, const Probs& probs_ = Probs()) : name(name_), desc(desc_), redundantBufferFactor(bufFact), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload buffer data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadBuffer(1.0f)),

			Case("always_reupload_bufferdata",
				 "Re-upload buffer data at the beginning of each iteration, using glBufferData",
				 -1,
				 Probs().pReuploadBuffer(1.0f).pReuploadWithBufferData(1.0f)),

			Case("always_delete",
				 "Delete buffers at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteBuffer(1.0f)),

			Case("wasteful",
				 "Don't reuse buffers, and only delete them when given memory limit is reached",
				 2,
				 Probs().pWastefulBufferMemoryUsage(1.0f)),

			Case("separate_attribute_buffers_wasteful",
				 "Give each vertex attribute its own buffer",
				 2,
				 Probs().pSeparateAttribBuffers(1.0f).pWastefulBufferMemoryUsage(1.0f))
		};

		TestCaseGroup* const bufferGroup = new TestCaseGroup(m_context, "buffer", "Buffer stress tests");
		addChild(bufferGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int redundantBufferFactor = cases[caseNdx].redundantBufferFactor > 0 ? cases[caseNdx].redundantBufferFactor : memoryLimitCases[memoryLimitNdx].redundantBufferFactor;

				bufferGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															  (string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															  (string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  0 /* tex memory */, memoryLimitCases[memoryLimitNdx].limit,
															  1 /* draw calls per iteration */, 50000 /* tris per call */,
															  contexts, cases[caseNdx].probs,
															  GL_DYNAMIC_DRAW, GL_DYNAMIC_DRAW,
															  redundantBufferFactor));
			}
		}
	}

	// Texture cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			numTextures;
			MemCase (const char* n, const char* d, int l, int t) : nameSuffix(n), descSuffix(d), limit(l), numTextures(t) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low texture memory usage limit",	8*Mi,		6),
			MemCase("_high_memory",	"; use a high texture memory usage limit",	256*Mi,		192)
		};

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			numTextures; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int numTextures_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), numTextures(numTextures_), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload texture data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadTexture(1.0f)),

			Case("always_reupload_teximage",
				 "Re-upload texture data at the beginning of each iteration, using glTexImage*",
				 -1,
				 Probs().pReuploadTexture(1.0f).pReuploadWithTexImage(1.0f)),

			Case("always_delete",
				 "Delete textures at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteTexture(1.0f)),

			Case("wasteful",
				 "Don't reuse textures, and only delete them when given memory limit is reached",
				 6,
				 Probs().pWastefulTextureMemoryUsage(1.0f))
		};

		TestCaseGroup* const textureGroup = new TestCaseGroup(m_context, "texture", "Texture stress tests");
		addChild(textureGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int								numTextures		= cases[caseNdx].numTextures > 0 ? cases[caseNdx].numTextures : memoryLimitCases[memoryLimitNdx].numTextures;
				const std::vector<gls::ProgramContext>	contexts		(1, progLib.generateTextureContext(numTextures, 512, 512, 0.1f));

				textureGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
																(string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
																(string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
																memoryLimitCases[memoryLimitNdx].limit, 1*Mi /* buf memory */,
																1 /* draw calls per iteration */, 10000 /* tris per call */,
																contexts, cases[caseNdx].probs,
																GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}

	// Draw call cases.

	{
		const std::vector<gls::ProgramContext> contexts(1, progLib.generateTextureContext(1, 128, 128, 0.5f));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			drawCallsPerIteration;
			const int			numTrisPerDrawCall;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const int calls, const int tris, const Probs& probs_ = Probs())
				: name(name_), desc(desc_), drawCallsPerIteration(calls), numTrisPerDrawCall(tris), probs(probs_) {}
		} cases[] =
		{
			Case("client_memory_data",
				 "Use client-memory for index and attribute data, instead of GL buffers",
				 200, 500,
				 Probs().pClientMemoryAttributeData(1.0f).pClientMemoryIndexData(1.0f)),

			Case("vary_draw_function",
				 "Choose between glDrawElements and glDrawArrays each iteration, with uniform probability",
				 200, 500,
				 Probs().pUseDrawArrays(0.5f)),

			Case("few_big_calls",
				 "Per iteration, do a few draw calls with a big number of triangles per call",
				 2, 50000),

			Case("many_small_calls",
				 "Per iteration, do many draw calls with a small number of triangles per call",
				 2000, 50)
		};

		TestCaseGroup* const drawCallGroup = new TestCaseGroup(m_context, "draw_call", "Draw call stress tests");
		addChild(drawCallGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			drawCallGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															cases[caseNdx].name, cases[caseNdx].desc,
															1*Mi /* tex memory */, 2*Mi /* buf memory */,
															cases[caseNdx].drawCallsPerIteration, cases[caseNdx].numTrisPerDrawCall,
															contexts, cases[caseNdx].probs,
															GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Shader cases.

	{
		std::vector<gls::ProgramContext> contexts;
		contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
		contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), probs(probs_) {}
		} cases[] =
		{
			Case("several_programs",
				 "Use several different programs, choosing between them uniformly on each iteration"),

			Case("several_programs_always_rebuild",
				 "Use several different programs, choosing between them uniformly on each iteration, and always rebuild the program",
				 Probs().pRebuildProgram(1.0f))
		};

		TestCaseGroup* const shaderGroup = new TestCaseGroup(m_context, "program", "Shader program stress tests");
		addChild(shaderGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			shaderGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														  cases[caseNdx].name, cases[caseNdx].desc,
														  3*Mi /* tex memory */, 1*Mi /* buf memory */,
														  1 /* draw calls per iteration */, 10000 /* tris per call */,
														  contexts, cases[caseNdx].probs,
														  GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Mixed cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			texLimit;
			const int			bufLimit;
			MemCase (const char* n, const char* d, int t, int b) : nameSuffix(n), descSuffix(d), texLimit(t), bufLimit(b) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low memory usage limit",	8*Mi,	8*Mi),
			MemCase("_high_memory",	"; use a high memory usage limit",	128*Mi,	128*Mi)
		};

		TestCaseGroup* const mixedGroup = new TestCaseGroup(m_context, "mixed", "Mixed stress tests");
		addChild(mixedGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														 (string() + "buffer_texture_wasteful"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
														 (string() + "Use both buffers and textures wastefully"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
														 memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
														 1 /* draw calls per iteration */, 10000 /* tris per call */,
														 std::vector<gls::ProgramContext>(1, progLib.generateBufferAndTextureContext(4, 512, 512)),
														 Probs()
														 .pReuploadTexture				(0.3f)
														 .pReuploadWithTexImage			(0.5f)
														 .pReuploadBuffer				(0.3f)
														 .pReuploadWithBufferData		(0.5f)
														 .pDeleteTexture				(0.2f)
														 .pDeleteBuffer					(0.2f)
														 .pWastefulTextureMemoryUsage	(0.5f)
														 .pWastefulBufferMemoryUsage	(0.5f)
														 .pRandomBufferUploadTarget		(1.0f)
														 .pRandomBufferUsage			(1.0f),
														 GL_STATIC_DRAW, GL_STATIC_DRAW));

			{
				std::vector<gls::ProgramContext> contexts;
				contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
				contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));
				mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															 (string() + "random"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															 (string() + "Highly random behavior"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
															 1 /* draw calls per iteration */, 10000 /* tris per call */,
															 contexts,
															 Probs()
															 .pRebuildProgram				(0.3f)
															 .pReuploadTexture				(0.3f)
															 .pReuploadWithTexImage			(0.3f)
															 .pReuploadBuffer				(0.3f)
															 .pReuploadWithBufferData		(0.3f)
															 .pDeleteTexture				(0.2f)
															 .pDeleteBuffer					(0.2f)
															 .pWastefulTextureMemoryUsage	(0.3f)
															 .pWastefulBufferMemoryUsage	(0.3f)
															 .pClientMemoryAttributeData	(0.2f)
															 .pClientMemoryIndexData		(0.2f)
															 .pSeparateAttribBuffers		(0.4f)
															 .pUseDrawArrays				(0.4f)
															 .pRandomBufferUploadTarget		(1.0f)
															 .pRandomBufferUsage			(1.0f),
															 GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}
}